

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_utilities.hpp
# Opt level: O0

size_t jsoncons::jsonpath::escape_string<char,std::__cxx11::string>
                 (char *s,size_t length,
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sink)

{
  char cVar1;
  char in_DL;
  long in_RSI;
  char *in_RDI;
  char c;
  char *it;
  char *end;
  char *begin;
  size_t count;
  char *local_38;
  size_t local_20;
  
  local_20 = 0;
  for (local_38 = in_RDI; local_38 != in_RDI + in_RSI; local_38 = local_38 + 1) {
    cVar1 = *local_38;
    if (cVar1 == '\b') {
      std::__cxx11::string::push_back(in_DL);
      std::__cxx11::string::push_back(in_DL);
      local_20 = local_20 + 2;
    }
    else if (cVar1 == '\t') {
      std::__cxx11::string::push_back(in_DL);
      std::__cxx11::string::push_back(in_DL);
      local_20 = local_20 + 2;
    }
    else if (cVar1 == '\n') {
      std::__cxx11::string::push_back(in_DL);
      std::__cxx11::string::push_back(in_DL);
      local_20 = local_20 + 2;
    }
    else if (cVar1 == '\f') {
      std::__cxx11::string::push_back(in_DL);
      std::__cxx11::string::push_back(in_DL);
      local_20 = local_20 + 2;
    }
    else if (cVar1 == '\r') {
      std::__cxx11::string::push_back(in_DL);
      std::__cxx11::string::push_back(in_DL);
      local_20 = local_20 + 2;
    }
    else if (cVar1 == '\'') {
      std::__cxx11::string::push_back(in_DL);
      std::__cxx11::string::push_back(in_DL);
      local_20 = local_20 + 2;
    }
    else if (cVar1 == '\\') {
      std::__cxx11::string::push_back(in_DL);
      std::__cxx11::string::push_back(in_DL);
      local_20 = local_20 + 2;
    }
    else {
      std::__cxx11::string::push_back(in_DL);
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

std::size_t escape_string(const CharT* s, std::size_t length, Sink& sink)
    {
        std::size_t count = 0;
        const CharT* begin = s;
        const CharT* end = s + length;
        for (const CharT* it = begin; it != end; ++it)
        {
            CharT c = *it;
            switch (c)
            {
                case '\\':
                    sink.push_back('\\');
                    sink.push_back('\\');
                    count += 2;
                    break;
                case '\'':
                    sink.push_back('\\');
                    sink.push_back('\'');
                    count += 2;
                    break;
                case '\b':
                    sink.push_back('\\');
                    sink.push_back('b');
                    count += 2;
                    break;
                case '\f':
                    sink.push_back('\\');
                    sink.push_back('f');
                    count += 2;
                    break;
                case '\n':
                    sink.push_back('\\');
                    sink.push_back('n');
                    count += 2;
                    break;
                case '\r':
                    sink.push_back('\\');
                    sink.push_back('r');
                    count += 2;
                    break;
                case '\t':
                    sink.push_back('\\');
                    sink.push_back('t');
                    count += 2;
                    break;
                default:
                    sink.push_back(c);
                    ++count;
                    break;
            }
        }
        return count;
    }